

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O2

bool __thiscall QProcessPrivate::startDetached(QProcessPrivate *this,qint64 *pid)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  int __pid;
  __pid_t _Var4;
  int *piVar5;
  qint64 qVar6;
  storage_type *psVar7;
  qsizetype qVar8;
  long lVar9;
  ssize_t bytesRead;
  qint64 *pqVar10;
  ChildError *childLambda;
  EVP_PKEY_CTX *ctx;
  int in_R8D;
  long in_FS_OFFSET;
  QUtf8StringView fnName;
  QUtf8StringView fnName_00;
  pid_t actualPid;
  int result;
  ChildError childStatus;
  QChildProcess childProcess;
  AutoPipe pidPipe;
  AutoPipe startedPipe;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  startedPipe.pipe = (int  [2])&DAT_aaaaaaaaaaaaaaaa;
  pqVar10 = pid;
  anon_unknown.dwarf_133c8f4::AutoPipe::AutoPipe(&startedPipe,(int)pid);
  pidPipe.pipe = (int  [2])&DAT_aaaaaaaaaaaaaaaa;
  anon_unknown.dwarf_133c8f4::AutoPipe::AutoPipe(&pidPipe,(int)pqVar10);
  if ((startedPipe.pipe[0] < 0) || (pidPipe.pipe[0] < 0)) {
    psVar7 = (storage_type *)
             QBasicUtf8StringView<false>::lengthHelperContainer<char,5ul>((char (*) [5])0x51e1cf);
    fnName.m_size = -1;
    fnName.m_data = psVar7;
    anon_unknown.dwarf_133c8f4::errorMessageForSyscall
              ((QString *)&childStatus,(anon_unknown_dwarf_133c8f4 *)0x51e1cf,fnName,in_R8D);
    setErrorAndEmit(this,FailedToStart,(QString *)&childStatus);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&childStatus);
  }
  else {
    bVar3 = openChannelsForDetached(this);
    if (bVar3) {
      memset(&childProcess,0xaa,0xd8);
      anon_unknown.dwarf_133c8f4::QChildProcess::QChildProcess(&childProcess,this);
      if (childProcess.workingDirectory == -1) {
LAB_003d44a8:
        bVar3 = false;
      }
      else {
        this->childStartedPipe[1] = startedPipe.pipe[1];
        childLambda = &childStatus;
        childStatus._0_8_ = &startedPipe;
        childStatus.function._4_8_ = &pidPipe;
        childStatus.function._12_8_ = &childProcess;
        childStatus.function._20_8_ = this;
        __pid = (anonymous_namespace)::QChildProcess::
                doFork<QProcessPrivate::startDetached(long_long*)::__0>
                          ((QChildProcess *)&childProcess,(anon_class_32_4_344bbdd6 *)childLambda);
        this->childStartedPipe[1] = -1;
        piVar5 = __errno_location();
        iVar1 = *piVar5;
        closeChannels(this);
        if (__pid == -1) {
          anon_unknown.dwarf_133c8f4::QChildProcess::cleanup
                    (&childProcess,(EVP_PKEY_CTX *)childLambda);
          qVar8 = QBasicUtf8StringView<false>::lengthHelperContainer<char,5ul>((char (*) [5])"fork")
          ;
          fnName_00.m_size._0_4_ = iVar1;
          fnName_00.m_data = (storage_type *)qVar8;
          fnName_00.m_size._4_4_ = 0;
          anon_unknown.dwarf_133c8f4::errorMessageForSyscall
                    ((QString *)&childStatus,(anon_unknown_dwarf_133c8f4 *)"fork",fnName_00,in_R8D);
          setErrorAndEmit(this,FailedToStart,(QString *)&childStatus);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&childStatus);
          goto LAB_003d44a8;
        }
        qt_safe_close(pidPipe.pipe[1]);
        qt_safe_close(startedPipe.pipe[1]);
        startedPipe.pipe[1] = -1;
        pidPipe.pipe[1] = -1;
        memset(&childStatus,0xaa,0x200);
        qVar6 = qt_safe_read(startedPipe.pipe[0],&childStatus,0x200);
        result = -0x55555556;
        do {
          ctx = (EVP_PKEY_CTX *)&result;
          _Var4 = waitpid(__pid,&result,0);
          if (_Var4 != -1) break;
        } while (*piVar5 == 4);
        bVar3 = qVar6 == 0;
        if (pid == (qint64 *)0x0 || !bVar3) {
          if (qVar6 != 0) {
            if (pid != (qint64 *)0x0) {
              *pid = -1;
            }
            anon_unknown.dwarf_133c8f4::QChildProcess::cleanup(&childProcess,ctx);
            anon_unknown.dwarf_133c8f4::startFailureErrorMessage
                      ((QString *)&actualPid,&childStatus,bytesRead);
            setErrorAndEmit(this,FailedToStart,(QString *)&actualPid);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&actualPid);
          }
        }
        else {
          actualPid = -0x55555556;
          qVar6 = qt_safe_read(pidPipe.pipe[0],&actualPid,4);
          lVar9 = 0;
          if (qVar6 == 4) {
            lVar9 = (long)actualPid;
          }
          *pid = lVar9;
        }
      }
      anon_unknown.dwarf_133c8f4::QChildProcess::~QChildProcess(&childProcess);
      goto LAB_003d44b7;
    }
    closeChannels(this);
  }
  bVar3 = false;
LAB_003d44b7:
  anon_unknown.dwarf_133c8f4::AutoPipe::~AutoPipe(&pidPipe);
  anon_unknown.dwarf_133c8f4::AutoPipe::~AutoPipe(&startedPipe);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QProcessPrivate::startDetached(qint64 *pid)
{
    AutoPipe startedPipe, pidPipe;
    if (!startedPipe || !pidPipe) {
        setErrorAndEmit(QProcess::FailedToStart, errorMessageForSyscall("pipe"));
        return false;
    }

    if (!openChannelsForDetached()) {
        // openChannel sets the error string
        closeChannels();
        return false;
    }

    // see startProcess() for more information
    QChildProcess childProcess(this);
    if (!childProcess.ok()) {
        Q_ASSERT(processError != QProcess::UnknownError);
        return false;
    }

    childStartedPipe[1] = startedPipe[1];   // for failChildProcess()
    pid_t childPid = childProcess.doFork([&] {
        ::setsid();

        qt_safe_close(startedPipe[0]);
        qt_safe_close(pidPipe[0]);

        pid_t doubleForkPid;
        if (childProcess.startChild(&doubleForkPid) == -1)
            failChildProcess(this, "fork", errno);

        // success
        qt_safe_write(pidPipe[1], &doubleForkPid, sizeof(pid_t));
        return 0;
    });
    childStartedPipe[1] = -1;

    int savedErrno = errno;
    closeChannels();

    if (childPid == -1) {
        childProcess.cleanup();
        setErrorAndEmit(QProcess::FailedToStart, errorMessageForSyscall("fork", savedErrno));
        return false;
    }

    // close the writing ends of the pipes so we can properly get EOFs
    qt_safe_close(pidPipe[1]);
    qt_safe_close(startedPipe[1]);
    pidPipe[1] = startedPipe[1] = -1;

    // This read() will block until we're cleared to proceed. If it returns 0
    // (EOF), it means the direct child has exited and the grandchild
    // successfully execve()'d the target process. If it returns any positive
    // result, it means one of the two children wrote an error result. Negative
    // values should not happen.
    ChildError childStatus;
    ssize_t startResult = qt_safe_read(startedPipe[0], &childStatus, sizeof(childStatus));

    // reap the intermediate child
    int result;
    qt_safe_waitpid(childPid, &result, 0);

    bool success = (startResult == 0);  // nothing written -> no error
    if (success && pid) {
        pid_t actualPid;
        if (qt_safe_read(pidPipe[0], &actualPid, sizeof(pid_t)) != sizeof(pid_t))
            actualPid = 0;              // this shouldn't happen!
        *pid = actualPid;
    } else if (!success) {
        if (pid)
            *pid = -1;
        childProcess.cleanup();
        setErrorAndEmit(QProcess::FailedToStart,
                        startFailureErrorMessage(childStatus, startResult));
    }
    return success;
}